

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# do_wear.c
# Opt level: O2

int cursed(obj *otmp)

{
  int iVar1;
  char *pcVar2;
  
  if (uwep == otmp) {
    iVar1 = welded(otmp);
    if (iVar1 != 0) goto LAB_001835cb;
  }
  else if ((otmp->field_0x4a & 1) != 0) {
LAB_001835cb:
    pcVar2 = "They are";
    if (((otmp->quan < 2) && (otmp->oartifact != '\x1d')) && ((long)otmp->otyp != 0xed)) {
      if (otmp->oclass == '\x03') {
        if ((objects[otmp->otyp].oc_subtyp != '\x04') &&
           (pcVar2 = "It is", objects[otmp->otyp].oc_subtyp == '\x03')) {
          pcVar2 = "They are";
        }
      }
      else {
        pcVar2 = "It is";
      }
    }
    pline("You can\'t.  %s cursed.",pcVar2);
    otmp->field_0x4a = otmp->field_0x4a | 0x40;
    return 1;
  }
  return 0;
}

Assistant:

int cursed(struct obj *otmp)
{
	/* Curses, like chickens, come home to roost. */
	if ((otmp == uwep) ? welded(otmp) : (int)otmp->cursed) {
		pline("You can't.  %s cursed.",
			(is_plural(otmp) || otmp->otyp == LENSES ||
			 is_boots(otmp) || is_gloves(otmp)) ?
			"They are" : "It is");
		otmp->bknown = TRUE;
		return 1;
	}
	return 0;
}